

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O0

RC __thiscall QL_Manager::ParseRelNoDup(QL_Manager *this,int nRelations,char **relations)

{
  char *pcVar1;
  bool bVar2;
  _Self local_a8;
  _Self local_a0;
  undefined1 local_95;
  bool exists;
  allocator local_81;
  undefined1 local_80 [8];
  string relString;
  undefined1 local_58 [4];
  int i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  relationSet;
  char **relations_local;
  int nRelations_local;
  QL_Manager *this_local;
  
  relationSet._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)relations;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)local_58);
  for (relString.field_2._12_4_ = 0; (int)relString.field_2._12_4_ < nRelations;
      relString.field_2._12_4_ = relString.field_2._12_4_ + 1) {
    pcVar1 = *(char **)(relationSet._M_t._M_impl.super__Rb_tree_header._M_node_count +
                       (long)(int)relString.field_2._12_4_ * 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_80,pcVar1,&local_81);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    local_a0._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_58,(key_type *)local_80);
    local_a8._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_58);
    local_95 = std::operator!=(&local_a0,&local_a8);
    bVar2 = !(bool)local_95;
    if (bVar2) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_58,(value_type *)local_80);
    }
    else {
      this_local._4_4_ = 0x192;
    }
    std::__cxx11::string::~string((string *)local_80);
    if (!bVar2) goto LAB_0011694b;
  }
  this_local._4_4_ = 0;
LAB_0011694b:
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_58);
  return this_local._4_4_;
}

Assistant:

RC QL_Manager::ParseRelNoDup(int nRelations, const char * const relations[]){
  set<string> relationSet;
  for(int i = 0; i < nRelations; i++){
    string relString(relations[i]);
    bool exists = (relationSet.find(relString) != relationSet.end());
    if(exists)
      return (QL_DUPRELATION);
    relationSet.insert(relString);
  }
  return (0);
}